

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
::find<google::protobuf::Symbol>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
           *this,key_arg<google::protobuf::Symbol> *key)

{
  ctrl_t *pcVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ctrl_t cVar6;
  ctrl_t cVar7;
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  bool bVar22;
  ushort uVar23;
  Symbol *key_1;
  uint64_t uVar24;
  ctrl_t *pcVar25;
  slot_type *psVar26;
  Symbol *b;
  Symbol *b_00;
  anon_union_8_1_a8a14541_for_iterator_2 extraout_RDX;
  ulong uVar27;
  undefined1 *unaff_R13;
  undefined1 uVar28;
  uint uVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  string_view sVar34;
  iterator iVar35;
  iterator iVar36;
  __m128i match;
  ulong local_88;
  anon_union_8_1_a8a14541_for_iterator_2 local_60;
  ctrl_t local_58;
  ctrl_t cStack_57;
  ctrl_t cStack_56;
  ctrl_t cStack_55;
  
  AssertOnFind<google::protobuf::Symbol>(this,key);
  sVar2 = (this->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  if (sVar2 == 1) {
    AssertNotDebugCapacity(this);
    if (1 < (this->settings_).
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            size_) {
      psVar26 = soo_slot(this);
      bVar22 = google::protobuf::(anonymous_namespace)::SymbolByFullNameEq::operator()
                         (psVar26,key,b_00);
      if (bVar22) {
        local_60.slot_ = soo_slot(this);
        unaff_R13 = kSooControl;
        goto LAB_001723fc;
      }
    }
    AssertNotDebugCapacity(this);
    unaff_R13 = (ctrl_t *)0x0;
    local_60 = extraout_RDX;
LAB_001723fc:
    iVar36.field_1.slot_ = local_60.slot_;
    iVar36.ctrl_ = unaff_R13;
    return iVar36;
  }
  if (sVar2 != 0) {
    prefetch_heap_block(this);
    sVar34 = google::protobuf::Symbol::full_name(key);
    uVar24 = hash_internal::MixingHashState::CombineContiguousImpl
                       (&hash_internal::MixingHashState::kSeed,sVar34._M_str,sVar34._M_len);
    uVar3 = (this->settings_).
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            capacity_;
    if (uVar3 == 1) {
      __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe2a,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                   );
    }
    if (uVar3 != 0) {
      if ((uVar3 + 1 & uVar3) != 0) {
        __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x14c,
                      "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                     );
      }
      uVar30 = (uVar24 ^ sVar34._M_len) * -0x234dd359734ecb13;
      local_88 = ((uVar30 >> 0x38 | (uVar30 & 0xff000000000000) >> 0x28 |
                   (uVar30 & 0xff0000000000) >> 0x18 | (uVar30 & 0xff00000000) >> 8 |
                   (uVar30 & 0xff000000) << 8 | (uVar30 & 0xff0000) << 0x18 |
                   (uVar30 & 0xff00) << 0x28 | uVar30 << 0x38) >> 7 ^
                 (ulong)(this->settings_).
                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                        .value.heap_or_soo_.heap.control >> 0xc) & uVar3;
      pcVar25 = control(this);
      uVar28 = (undefined1)(uVar30 >> 0x38);
      auVar31 = ZEXT216(CONCAT11(uVar28,uVar28) & 0x7f7f);
      auVar31 = pshuflw(auVar31,auVar31,0);
      uVar30 = 0;
      do {
        pcVar1 = pcVar25 + local_88;
        cVar6 = *pcVar1;
        cVar7 = pcVar1[1];
        cVar8 = pcVar1[2];
        cVar9 = pcVar1[3];
        cVar10 = pcVar1[4];
        cVar11 = pcVar1[5];
        cVar12 = pcVar1[6];
        cVar13 = pcVar1[7];
        cVar14 = pcVar1[8];
        cVar15 = pcVar1[9];
        cVar16 = pcVar1[10];
        cVar17 = pcVar1[0xb];
        cVar18 = pcVar1[0xc];
        cVar19 = pcVar1[0xd];
        cVar20 = pcVar1[0xe];
        cVar21 = pcVar1[0xf];
        local_58 = auVar31[0];
        cStack_57 = auVar31[1];
        cStack_56 = auVar31[2];
        cStack_55 = auVar31[3];
        auVar32[0] = -(local_58 == cVar6);
        auVar32[1] = -(cStack_57 == cVar7);
        auVar32[2] = -(cStack_56 == cVar8);
        auVar32[3] = -(cStack_55 == cVar9);
        auVar32[4] = -(local_58 == cVar10);
        auVar32[5] = -(cStack_57 == cVar11);
        auVar32[6] = -(cStack_56 == cVar12);
        auVar32[7] = -(cStack_55 == cVar13);
        auVar32[8] = -(local_58 == cVar14);
        auVar32[9] = -(cStack_57 == cVar15);
        auVar32[10] = -(cStack_56 == cVar16);
        auVar32[0xb] = -(cStack_55 == cVar17);
        auVar32[0xc] = -(local_58 == cVar18);
        auVar32[0xd] = -(cStack_57 == cVar19);
        auVar32[0xe] = -(cStack_56 == cVar20);
        auVar32[0xf] = -(cStack_55 == cVar21);
        uVar23 = (ushort)(SUB161(auVar32 >> 7,0) & 1) | (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe | (ushort)(auVar32[0xf] >> 7) << 0xf
        ;
        uVar29 = (uint)uVar23;
        while( true ) {
          iVar35.field_1 =
               (anon_union_8_1_a8a14541_for_iterator_2)
               (anon_union_8_1_a8a14541_for_iterator_2)local_60.slot_;
          iVar35.ctrl_ = unaff_R13;
          if (uVar23 == 0) break;
          uVar5 = 0;
          if (uVar29 != 0) {
            for (; (uVar29 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
            }
          }
          psVar26 = slot_array(this);
          uVar27 = uVar5 + local_88 & uVar3;
          bVar22 = google::protobuf::(anonymous_namespace)::SymbolByFullNameEq::operator()
                             (psVar26 + uVar27,key,b);
          if (bVar22) {
            iVar35 = iterator_at(this,uVar27);
            break;
          }
          uVar23 = (ushort)(uVar29 - 1) & (ushort)uVar29;
          uVar29 = CONCAT22((short)(uVar29 - 1 >> 0x10),uVar23);
        }
        local_60 = iVar35.field_1;
        unaff_R13 = iVar35.ctrl_;
        if (uVar23 != 0) {
LAB_00172365:
          bVar22 = false;
          uVar27 = uVar30;
        }
        else {
          auVar33[0] = -(cVar6 == kEmpty);
          auVar33[1] = -(cVar7 == kEmpty);
          auVar33[2] = -(cVar8 == kEmpty);
          auVar33[3] = -(cVar9 == kEmpty);
          auVar33[4] = -(cVar10 == kEmpty);
          auVar33[5] = -(cVar11 == kEmpty);
          auVar33[6] = -(cVar12 == kEmpty);
          auVar33[7] = -(cVar13 == kEmpty);
          auVar33[8] = -(cVar14 == kEmpty);
          auVar33[9] = -(cVar15 == kEmpty);
          auVar33[10] = -(cVar16 == kEmpty);
          auVar33[0xb] = -(cVar17 == kEmpty);
          auVar33[0xc] = -(cVar18 == kEmpty);
          auVar33[0xd] = -(cVar19 == kEmpty);
          auVar33[0xe] = -(cVar20 == kEmpty);
          auVar33[0xf] = -(cVar21 == kEmpty);
          if ((((((((((((((((auVar33 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar33 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar33 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar33 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar33 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar33 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar33 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar33 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar33 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar33 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar33 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar33 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              cVar21 == kEmpty) {
            AssertNotDebugCapacity(this);
            unaff_R13 = (ctrl_t *)0x0;
            goto LAB_00172365;
          }
          uVar4 = (this->settings_).
                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                  value.capacity_;
          if (uVar4 == 0) goto LAB_0017240b;
          uVar27 = uVar30 + 0x10;
          if (uVar4 < uVar27) {
            __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0xe37,
                          "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                         );
          }
          local_88 = local_88 + uVar30 + 0x10 & uVar3;
          bVar22 = true;
        }
        uVar30 = uVar27;
      } while (bVar22);
      goto LAB_001723fc;
    }
  }
LAB_0017240b:
  __assert_fail("cap >= kDefaultCapacity",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xb75,
                "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>]"
               );
}

Assistant:

iterator find(const key_arg<K>& key) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    AssertOnFind(key);
    if (is_soo()) return find_soo(key);
    prefetch_heap_block();
    return find_non_soo(key, hash_ref()(key));
  }